

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O1

bool __thiscall
mip_converter_test::MIPInstance::Objective::operator==(Objective *this,Objective *obj)

{
  Sense SVar1;
  Sense SVar2;
  bool bVar3;
  pointer pdVar4;
  ulong uVar5;
  
  SVar1 = this->sense_;
  SVar2 = obj->sense_;
  bVar3 = SparseVec::operator==(&this->le_,&obj->le_);
  if (SVar1 != SVar2) {
    puts("Diff sense");
  }
  if (!bVar3) {
    puts("Diff coefs");
    pdVar4 = (this->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar4) {
      uVar5 = 0;
      do {
        printf(" %d:%f",pdVar4[uVar5],
               (ulong)(uint)(this->le_).v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar5]);
        uVar5 = uVar5 + 1;
        pdVar4 = (this->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->le_).c_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
    }
    putchar(10);
    pdVar4 = (obj->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((obj->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar4) {
      uVar5 = 0;
      do {
        printf(" %d:%f",pdVar4[uVar5],
               (ulong)(uint)(obj->le_).v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar5]);
        uVar5 = uVar5 + 1;
        pdVar4 = (obj->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(obj->le_).c_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
    }
    putchar(10);
  }
  return SVar1 == SVar2 && bVar3;
}

Assistant:

bool operator==(const Objective& obj) const {
      bool eq1 = sense_==obj.sense_;
      bool eq2 = le_==obj.le_;
      if (!eq1)
        printf("Diff sense\n");
      if (!eq2) {
        printf("Diff coefs\n");
        for (size_t i=0; i<le_.size(); ++i) {
          printf(" %d:%f", le_.v_[i], le_.c_[i]);
        }
        printf("\n");
        for (size_t i=0; i<obj.le_.size(); ++i) {
          printf(" %d:%f", obj.le_.v_[i], obj.le_.c_[i]);
        }
        printf("\n");
      }
      return eq1 && eq2;
    }